

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

bool CB_ADF::test_adf_sequence(multi_ex *ec_seq)

{
  bool bVar1;
  size_type sVar2;
  reference ppeVar3;
  size_t sVar4;
  string *pmessage;
  cb_class *pcVar5;
  ostream *poVar6;
  undefined8 uVar7;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  stringstream __msg_2;
  stringstream __msg_1;
  stringstream __msg;
  example *ec;
  size_t k;
  uint32_t count;
  example *in_stack_fffffffffffffaa8;
  ulong uVar8;
  int iVar9;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  undefined1 uVar10;
  vw_exception *in_stack_fffffffffffffac0;
  stringstream local_520 [16];
  ostream local_510;
  undefined1 local_391;
  stringstream local_370 [16];
  ostream local_360;
  undefined1 local_1e1;
  stringstream local_1b0 [16];
  ostream local_1a0;
  value_type local_28;
  ulong local_20;
  int local_14;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  bool local_1;
  
  local_14 = 0;
  local_20 = 0;
  local_10 = in_RDI;
  while( true ) {
    uVar8 = local_20;
    sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10);
    if (sVar2 <= uVar8) {
      if (local_14 == 0) {
        local_1 = true;
      }
      else {
        if (local_14 != 1) {
          std::__cxx11::stringstream::stringstream(local_520);
          iVar9 = (int)(uVar8 >> 0x20);
          std::operator<<(&local_510,
                          "cb_adf: badly formatted example, only one line can have a cost");
          uVar10 = 1;
          uVar7 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffffac0,(char *)CONCAT17(uVar10,in_stack_fffffffffffffab8),
                     iVar9,(string *)in_stack_fffffffffffffaa8);
          __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        local_1 = false;
      }
      return local_1;
    }
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_20);
    iVar9 = (int)(uVar8 >> 0x20);
    local_28 = *ppeVar3;
    sVar4 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&(local_28->l).simple);
    if (1 < sVar4) break;
    sVar4 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&(local_28->l).simple);
    if (sVar4 == 1) {
      pcVar5 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&(local_28->l).simple,0);
      if ((pcVar5->cost != 3.4028235e+38) || (NAN(pcVar5->cost))) {
        local_14 = local_14 + 1;
      }
    }
    bVar1 = CB::ec_is_example_header(in_stack_fffffffffffffaa8);
    if ((bVar1) && (local_20 != 0)) {
      std::__cxx11::stringstream::stringstream(local_370);
      poVar6 = std::operator<<(&local_360,"warning: example headers at position ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_20);
      std::operator<<(poVar6,": can only have in initial position!");
      local_391 = 1;
      uVar7 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffac0,
                 (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),iVar9,
                 (string *)in_stack_fffffffffffffaa8);
      local_391 = 0;
      __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_20 = local_20 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(&local_1a0,"cb_adf: badly formatted example, only one cost can be known.");
  local_1e1 = 1;
  pmessage = (string *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (in_stack_fffffffffffffac0,
             (char *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),iVar9,pmessage);
  local_1e1 = 0;
  __cxa_throw(pmessage,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

bool test_adf_sequence(multi_ex& ec_seq)
{
  uint32_t count = 0;
  for (size_t k = 0; k < ec_seq.size(); k++)
  {
    example* ec = ec_seq[k];
    if (ec->l.cb.costs.size() > 1)
      THROW("cb_adf: badly formatted example, only one cost can be known.");

    if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX)
      count += 1;

    if (CB::ec_is_example_header(*ec))
      if (k != 0)
        THROW("warning: example headers at position " << k << ": can only have in initial position!");
  }
  if (count == 0)
    return true;
  else if (count == 1)
    return false;
  else
    THROW("cb_adf: badly formatted example, only one line can have a cost");
}